

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O2

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Bac_Man_t *p;
  Bac_Ntk_t *pBVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Bac_Ntk_t *pBVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  int Count;
  uint uVar12;
  ulong uVar13;
  int i;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  p = (Bac_Man_t *)pAbc->pAbcBac;
  uVar4 = 0;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Mvh"), iVar5 = globalUtilOptind, iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) {
      if (p != (Bac_Man_t *)0x0) {
        pBVar7 = Bac_ManRoot(p);
        uVar12 = 0;
        printf("%-12s : ",p->pName);
        printf("pi =%5d  ",(ulong)(uint)(pBVar7->vInputs).nSize);
        printf("po =%5d  ",(ulong)(uint)(pBVar7->vOutputs).nSize);
        iVar5 = Abc_NamObjNumMax(p->pMods);
        printf("pri =%4d  ",(ulong)(uint)(iVar5 - p->nNtks));
        printf("mod =%6d  ",(ulong)(uint)p->nNtks);
        lVar11 = 0xd0;
        for (lVar14 = 1; lVar14 <= p->nNtks; lVar14 = lVar14 + 1) {
          iVar5 = Bac_NtkBoxNum((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar11));
          uVar12 = uVar12 + iVar5;
          lVar11 = lVar11 + 0xd0;
        }
        uVar15 = 0;
        printf("box =%7d  ",(ulong)uVar12);
        uVar13 = (ulong)(uint)p->nNtks;
        if (p->nNtks < 1) {
          uVar13 = uVar15;
        }
        uVar10 = 0;
        for (; uVar13 * 0xd0 - uVar15 != 0; uVar15 = uVar15 + 0xd0) {
          uVar10 = (ulong)(uint)((int)uVar10 + *(int *)((long)&p->pNtks[1].vType.nSize + uVar15));
        }
        printf("obj =%7d  ",uVar10);
        if (p->pName == (char *)0x0) {
          iVar5 = 0x530;
        }
        else {
          sVar8 = strlen(p->pName);
          iVar5 = (int)sVar8 + 0x530;
        }
        if (p->pSpec != (char *)0x0) {
          sVar8 = strlen(p->pSpec);
          iVar5 = iVar5 + (int)sVar8;
        }
        iVar3 = Abc_NamMemUsed(p->pStrs);
        iVar6 = Abc_NamMemUsed(p->pMods);
        iVar6 = iVar6 + iVar3 + iVar5;
        uVar15 = 0;
        uVar13 = (ulong)(uint)p->nNtks;
        if (p->nNtks < 1) {
          uVar13 = uVar15;
        }
        dVar16 = (double)DAT_007c84d0;
        dVar17 = DAT_007c84d0._8_8_;
        for (; uVar13 * 0xd0 - uVar15 != 0; uVar15 = uVar15 + 0xd0) {
          pBVar7 = p->pNtks;
          iVar5 = *(int *)((long)&pBVar7[1].vType.nCap + uVar15);
          auVar18._8_4_ = iVar5 >> 0x1f;
          auVar18._0_8_ = (long)iVar5;
          auVar18._12_4_ = 0x45300000;
          auVar21._4_4_ = 0;
          auVar21._0_4_ = *(uint *)((long)&pBVar7[1].vFanout.nCap + uVar15);
          auVar21._8_4_ = *(undefined4 *)((long)&pBVar7[1].vCopy.nCap + uVar15);
          auVar21._12_4_ = 0;
          auVar20._4_4_ = 0;
          auVar20._0_4_ = *(uint *)((long)&pBVar7[1].vIndex.nCap + uVar15);
          auVar20._8_4_ = *(undefined4 *)((long)&pBVar7[1].vName.nCap + uVar15);
          auVar20._12_4_ = 0;
          auVar22._4_4_ = 0;
          auVar22._0_4_ = *(uint *)((long)&pBVar7[1].vInfo.nCap + uVar15);
          auVar22._8_4_ = *(undefined4 *)((long)&pBVar7[1].vFanin.nCap + uVar15);
          auVar22._12_4_ = 0;
          auVar19._4_4_ = 0;
          auVar19._0_4_ = *(uint *)((long)&pBVar7[1].vInputs.nCap + uVar15);
          auVar19._8_4_ = *(undefined4 *)((long)&pBVar7[1].vOutputs.nCap + uVar15);
          auVar19._12_4_ = 0;
          iVar6 = iVar6 + (int)((SUB168(auVar22 | _DAT_007c84d0,8) - dVar17) * 4.0 + 16.0) +
                          (int)((SUB168(auVar21 | _DAT_007c84d0,8) - dVar17) * 4.0 + 16.0) +
                          (int)((SUB168(auVar19 | _DAT_007c84d0,8) - dVar17) * 4.0 + 16.0) +
                          (int)((SUB168(auVar20 | _DAT_007c84d0,8) - dVar17) * 4.0 + 16.0) +
                          (int)((SUB168(auVar22 | _DAT_007c84d0,0) - dVar16) * 4.0 + 16.0) +
                          (int)((SUB168(auVar21 | _DAT_007c84d0,0) - dVar16) * 4.0 + 16.0) +
                          (int)((SUB168(auVar19 | _DAT_007c84d0,0) - dVar16) * 4.0 + 16.0) +
                          (int)((SUB168(auVar20 | _DAT_007c84d0,0) - dVar16) * 4.0 + 16.0) +
                          (int)((auVar18._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0) + 16.0) +
                  0xd0;
        }
        printf("mem =%6.3f MB",(double)iVar6 * 9.5367431640625e-07);
        putchar(10);
        iVar5 = p->nNtks;
        lVar11 = 0xe8;
        for (lVar14 = 1; lVar14 <= iVar5; lVar14 = lVar14 + 1) {
          *(undefined4 *)((long)&p->pNtks->pDesign + lVar11) = 0xffffffff;
          lVar11 = lVar11 + 0xd0;
        }
        pBVar7 = Bac_ManRoot(p);
        Bac_ManBoxNum_rec(pBVar7);
        lVar14 = 0xd0;
        for (uVar13 = 1; ((long)uVar13 <= (long)p->nNtks && (uVar13 - uVar4 != 1));
            uVar13 = uVar13 + 1) {
          pBVar1 = p->pNtks;
          pBVar7 = (Bac_Ntk_t *)((long)&pBVar1->pDesign + lVar14);
          printf("Module %5d : ",uVar13 & 0xffffffff);
          printf("pi =%5d  ",(ulong)*(uint *)((long)&(pBVar1->vInputs).nSize + lVar14));
          printf("pi =%5d  ",(ulong)*(uint *)((long)&(pBVar1->vOutputs).nSize + lVar14));
          uVar12 = Bac_NtkBoxNum(pBVar7);
          printf("box =%6d  ",(ulong)uVar12);
          printf("clp =%7d  ",(ulong)*(uint *)((long)&pBVar1->Count + lVar14));
          printf("obj =%7d  ",(ulong)*(uint *)((long)&(pBVar1->vType).nSize + lVar14));
          pcVar9 = Bac_NtkName(pBVar7);
          printf("%s ",pcVar9);
          iVar5 = *(int *)((long)&pBVar1->iBoxNtk + lVar14);
          if ((0 < (long)iVar5) && (iVar5 <= pBVar7->pDesign->nNtks)) {
            pcVar9 = Bac_NtkName(pBVar7->pDesign->pNtks + iVar5);
            printf("-> %s",pcVar9);
          }
          putchar(10);
          lVar14 = lVar14 + 0xd0;
        }
        return 0;
      }
      Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
      return 0;
    }
    if (iVar3 != 0x4d) goto LAB_00339d79;
    if (argc <= globalUtilOptind) break;
    uVar4 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar4 < 0) {
LAB_00339d79:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",(ulong)uVar4)
      ;
      pcVar9 = "yes";
      if (!bVar2) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
  goto LAB_00339d79;
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}